

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O2

Diagnostics * __thiscall
slang::DiagnosticEngine::setMappingsFromPragmas
          (Diagnostics *__return_storage_ptr__,DiagnosticEngine *this,BufferID buffer)

{
  span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL> directives;
  
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)(__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  directives = SourceManager::getDiagnosticDirectives(this->sourceManager,buffer);
  if (directives._M_extent._M_extent_value._M_extent_value != 0) {
    setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>
              (this,buffer,directives,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Diagnostics DiagnosticEngine::setMappingsFromPragmas(BufferID buffer) {
    Diagnostics diags;
    auto directives = sourceManager.getDiagnosticDirectives(buffer);
    if (!directives.empty()) {
        setMappingsFromPragmasImpl<SourceManager::DiagnosticDirectiveInfo>(buffer, directives,
                                                                           diags);
    }

    return diags;
}